

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.cpp
# Opt level: O1

bool DefaultComparer<CaseNode_*>::Equals(CaseNode *caseNode1,CaseNode *caseNode2)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  int32 iVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  JITJavascriptString *aLeft;
  JITJavascriptString *aRight;
  
  bVar2 = CaseNode::IsIntConst(caseNode1,(caseNode1->caseInstr->super_Instr).m_src2);
  if ((bVar2) &&
     (bVar2 = CaseNode::IsIntConst(caseNode2,(caseNode2->caseInstr->super_Instr).m_src2), bVar2)) {
    iVar3 = CaseNode::GetUpperBoundIntConst(caseNode1);
    iVar4 = CaseNode::GetUpperBoundIntConst(caseNode2);
    return iVar3 == iVar4;
  }
  pSVar5 = IR::Opnd::GetStackSym((caseNode1->caseInstr->super_Instr).m_src2);
  if (((pSVar5->field_0x19 & 4) != 0) &&
     (pSVar5 = IR::Opnd::GetStackSym((caseNode2->caseInstr->super_Instr).m_src2),
     (pSVar5->field_0x19 & 4) != 0)) {
    aLeft = CaseNode::GetUpperBoundStrConst(caseNode1);
    aRight = CaseNode::GetUpperBoundStrConst(caseNode2);
    bVar2 = Js::JavascriptStringHelpers<JITJavascriptString>::Equals(aLeft,aRight);
    return bVar2;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.cpp"
                     ,0x29,"(false)",
                     "Should not reach here. CaseNodes should store only string or integer case values"
                    );
  if (bVar2) {
    *puVar6 = 0;
    return false;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool
DefaultComparer<CaseNode *>::Equals(CaseNode * caseNode1, CaseNode* caseNode2)
{
    if(caseNode1->IsUpperBoundIntConst() && caseNode2->IsUpperBoundIntConst())
    {
        int caseVal1 = caseNode1->GetUpperBoundIntConst();
        int caseVal2 = caseNode2->GetUpperBoundIntConst();
        return caseVal1 == caseVal2;
    }
    else if(caseNode1->IsUpperBoundStrConst() && caseNode2->IsUpperBoundStrConst())
    {
        JITJavascriptString * caseVal1 = caseNode1->GetUpperBoundStrConst();
        JITJavascriptString * caseVal2 = caseNode2->GetUpperBoundStrConst();
        return JITJavascriptString::Equals(caseVal1, caseVal2);
    }
    else
    {
        AssertMsg(false, "Should not reach here. CaseNodes should store only string or integer case values");
        return false;
    }
}